

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

int cimg_library::cimg::strcasecmp(char *__s1,char *__s2)

{
  size_t sVar1;
  size_t sVar2;
  int local_3c;
  int l2;
  int l1;
  char *str2_local;
  char *str1_local;
  
  if (__s1 == (char *)0x0) {
    str1_local._4_4_ = 0;
    if (__s2 != (char *)0x0) {
      str1_local._4_4_ = -1;
    }
  }
  else {
    sVar1 = strlen(__s1);
    sVar2 = strlen(__s2);
    local_3c = (int)sVar2;
    if ((int)sVar1 < local_3c) {
      local_3c = (int)sVar1;
    }
    str1_local._4_4_ = strncasecmp(__s1,__s2,(ulong)(local_3c + 1));
  }
  return str1_local._4_4_;
}

Assistant:

inline int strcasecmp(const char *const str1, const char *const str2) {
      if (!str1) return str2?-1:0;
      const int
        l1 = (int)std::strlen(str1),
        l2 = (int)std::strlen(str2);
      return cimg::strncasecmp(str1,str2,1 + (l1<l2?l1:l2));
    }